

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O2

int getopt_create_context(getopt_context_t *ctx,int argc,char **argv,getopt_option_t *opts)

{
  uint uVar1;
  char *pcVar2;
  int *piVar3;
  int iVar4;
  
  iVar4 = 0;
  if (1 < argc) {
    iVar4 = argc + -1;
  }
  ctx->argc = iVar4;
  ctx->argv = argv + (1 < argc);
  ctx->opts = opts;
  ctx->num_opts = 0;
  ctx->current_index = 0;
  ctx->current_opt_arg = (char *)0x0;
  piVar3 = &opts->name_short;
  iVar4 = 1;
  while( true ) {
    pcVar2 = ((getopt_option_t *)(piVar3 + -2))->name;
    if ((pcVar2 == (char *)0x0) && (*piVar3 == 0)) {
      return 0;
    }
    uVar1 = piVar3[4];
    if (((((ulong)uVar1 < 0x40) && ((0x8000080200000000U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
        (uVar1 == 0xffffffff)) || ((pcVar2 != (char *)0x0 && (*pcVar2 == '-')))) break;
    ctx->num_opts = iVar4;
    iVar4 = iVar4 + 1;
    piVar3 = piVar3 + 0xc;
  }
  return -1;
}

Assistant:

int getopt_create_context( getopt_context_t* ctx, int argc, const char** argv, const getopt_option_t* opts )
{
	ctx->argc            = (argc > 1) ? (argc - 1) : 0; /* stripping away file-name! */
	ctx->argv            = (argc > 1) ? (argv + 1) : argv; /* stripping away file-name! */
	ctx->opts            = opts;
	ctx->current_index   = 0;
	ctx->current_opt_arg = 0x0;

	/* count opts */
	ctx->num_opts = 0;
	const getopt_option_t* opt = opts;
	while( !(opt->name == 0x0 && opt->name_short == 0) )
	{
		if( opt->value == '!' || 
			opt->value == '?' || 
			opt->value == '+' || 
			opt->value == -1)
			return -1;

		if( opt->name )
		{
			if( opt->name[0] == '-' )
				return -1;
		}

		ctx->num_opts++; opt++;
	}

	return 0;
}